

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QString * __thiscall
QList<QString>::takeAt(QString *__return_storage_ptr__,QList<QString> *this,qsizetype i)

{
  qsizetype qVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  pointer pQVar5;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = data(this);
  pDVar3 = pQVar5[i].d.d;
  pcVar4 = pQVar5[i].d.ptr;
  pQVar5[i].d.d = (Data *)0x0;
  pQVar5[i].d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = pcVar4;
  qVar1 = pQVar5[i].d.size;
  pQVar5[i].d.size = 0;
  (__return_storage_ptr__->d).size = qVar1;
  pDVar2 = (this->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QString>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QString>::erase((QMovableArrayOps<QString> *)this,(this->d).ptr + i,1)
  ;
  return __return_storage_ptr__;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }